

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_channel_check_close(ssh1_channel *c)

{
  ssh1_connection_state *psVar1;
  _Bool _Var2;
  PktOut *pPVar3;
  PktOut *pktout;
  ssh1_connection_state *s;
  ssh1_channel *c_local;
  
  psVar1 = c->connlayer;
  if ((c->halfopen & 1U) == 0) {
    if (((((c->closes ^ 0xffffffffU) & 5) == 0) ||
        (_Var2 = chan_want_close(c->chan,(c->closes & 1U) != 0,(c->closes & 4U) != 0), _Var2)) &&
       ((c->closes & 2U) == 0)) {
      if ((c->closes & 1U) == 0) {
        pPVar3 = ssh_bpp_new_pktout((psVar1->ppl).bpp,0x18);
        BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
        pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar3->qnode);
        c->closes = c->closes | 1;
      }
      if ((c->closes & 4U) != 0) {
        pPVar3 = ssh_bpp_new_pktout((psVar1->ppl).bpp,0x19);
        BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
        pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar3->qnode);
        c->closes = c->closes | 2;
      }
    }
    if (((c->closes ^ 0xffffffffU) & 10) == 0) {
      ssh1_channel_destroy(c);
    }
  }
  return;
}

Assistant:

static void ssh1_channel_check_close(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    PktOut *pktout;

    if (c->halfopen) {
        /*
         * If we've sent out our own CHANNEL_OPEN but not yet seen
         * either OPEN_CONFIRMATION or OPEN_FAILURE in response, then
         * it's too early to be sending close messages of any kind.
         */
        return;
    }

    if ((!((CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE) & ~c->closes) ||
         chan_want_close(c->chan, (c->closes & CLOSES_SENT_CLOSE),
                         (c->closes & CLOSES_RCVD_CLOSE))) &&
        !(c->closes & CLOSES_SENT_CLOSECONF)) {
        /*
         * We have both sent and received CLOSE (or the channel type
         * doesn't need us to), which means the channel is in final
         * wind-up. Send CLOSE and/or CLOSE_CONFIRMATION, whichever we
         * haven't sent yet.
         */
        if (!(c->closes & CLOSES_SENT_CLOSE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSE;
        }
        if (c->closes & CLOSES_RCVD_CLOSE) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSECONF;
        }
    }

    if (!((CLOSES_SENT_CLOSECONF | CLOSES_RCVD_CLOSECONF) & ~c->closes)) {
        /*
         * We have both sent and received CLOSE_CONFIRMATION, which
         * means we're completely done with the channel.
         */
        ssh1_channel_destroy(c);
    }
}